

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_PartialEquivalencyTestExtraField_Test::
TestBody(MessageDifferencerTest_PartialEquivalencyTestExtraField_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_898;
  AssertHelper local_878;
  Message local_870;
  bool local_861;
  undefined1 local_860 [8];
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  undefined1 local_690 [8];
  TestAllTypes msg2;
  TestAllTypes msg1;
  MessageDifferencerTest_PartialEquivalencyTestExtraField_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_690);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::clear_optional_int32((TestAllTypes *)((long)&msg2.field_0 + 0x328))
  ;
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  util::MessageDifferencer::set_message_field_comparison
            ((MessageDifferencer *)&gtest_ar_.message_,EQUIVALENT);
  util::MessageDifferencer::set_scope((MessageDifferencer *)&gtest_ar_.message_,PARTIAL);
  local_861 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)&gtest_ar_.message_,
                         (Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_860,&local_861,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
  if (!bVar1) {
    testing::Message::Message(&local_870);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_898,(internal *)local_860,(AssertionResult *)0x1ebd035,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x325,message);
    testing::internal::AssertHelper::operator=(&local_878,&local_870);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    std::__cxx11::string::~string((string *)&local_898);
    testing::Message::~Message(&local_870);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  return;
}

Assistant:

TEST(MessageDifferencerTest, PartialEquivalencyTestExtraField) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  msg1.clear_optional_int32();

  // Compare
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}